

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_pass.h
# Opt level: O2

void __thiscall
mocker::PromoteGlobalVariables::PromoteGlobalVariables(PromoteGlobalVariables *this,Module *module)

{
  (this->super_ModulePass).module = module;
  (this->super_ModulePass).super_OptPass._vptr_OptPass =
       (_func_int **)&PTR__PromoteGlobalVariables_001f24f0;
  FuncAttr::FuncAttr(&this->funcGlobalVar);
  return;
}

Assistant:

explicit ModulePass(ir::Module &module) : module(module) {}